

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

optional<interfaces::BlockRef> * __thiscall node::anon_unknown_2::MinerImpl::getTip(MinerImpl *this)

{
  long lVar1;
  CBlockIndex *this_00;
  CBlockIndex *pCVar2;
  char *in_RSI;
  optional<interfaces::BlockRef> *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *tip;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  ChainstateManager *in_stack_ffffffffffffff68;
  BlockRef *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffffa8,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98
             ,in_RSI,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  chainman((MinerImpl *)in_stack_ffffffffffffff68);
  this_00 = (CBlockIndex *)ChainstateManager::ActiveChain(in_stack_ffffffffffffff68);
  pCVar2 = CChain::Tip((CChain *)this_00);
  if (pCVar2 == (CBlockIndex *)0x0) {
    std::optional<interfaces::BlockRef>::optional
              ((optional<interfaces::BlockRef> *)in_stack_ffffffffffffff68);
  }
  else {
    CBlockIndex::GetBlockHash(this_00);
    std::optional<interfaces::BlockRef>::optional<interfaces::BlockRef,_true>
              ((optional<interfaces::BlockRef> *)this_00,in_stack_ffffffffffffff70);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<BlockRef> getTip() override
    {
        LOCK(::cs_main);
        CBlockIndex* tip{chainman().ActiveChain().Tip()};
        if (!tip) return {};
        return BlockRef{tip->GetBlockHash(), tip->nHeight};
    }